

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_index.cpp
# Opt level: O3

int __thiscall BamTools::IndexTool::Run(IndexTool *this,int argc,char **argv)

{
  bool bVar1;
  IndexToolPrivate *this_00;
  
  Options::Parse(argc,argv,1);
  this_00 = (IndexToolPrivate *)operator_new(8);
  this_00->m_settings = this->m_settings;
  this->m_impl = this_00;
  bVar1 = IndexToolPrivate::Run(this_00);
  return (int)!bVar1;
}

Assistant:

int IndexTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize IndexTool with settings
    m_impl = new IndexToolPrivate(m_settings);

    // run IndexTool, return success/fail
    if (m_impl->Run())
        return 0;
    else
        return 1;
}